

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TabularDataFile.cpp
# Opt level: O2

int __thiscall asl::TabularDataFile::init(TabularDataFile *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  String SStack_28;
  
  this->_dataStarted = false;
  this->_separator = ',';
  this->_decimal = '.';
  this->_quote = '\"';
  String::repeat(&SStack_28,'\"',2);
  String::operator=(&this->_equote,&SStack_28);
  String::~String(&SStack_28);
  this->_flushEvery = 0;
  this->_rowIndex = 0;
  this->_quoteStrings = false;
  return extraout_EAX;
}

Assistant:

void TabularDataFile::init()
{
	_dataStarted = false;
	_separator = ',';
	_decimal = '.';
	_quote = '\"';
	_equote = String::repeat(_quote, 2);
	_flushEvery = 0;
	_rowIndex = 0;
	_quoteStrings = false;
}